

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

void __thiscall
cmComputeTargetDepends::OptimizeLinkDependencies
          (cmComputeTargetDepends *this,cmGeneratorTarget *gt,cmGraphEdgeList *outputEdges,
          cmGraphEdgeList *inputEdges)

{
  int iVar1;
  int iVar2;
  _Rb_tree_color _Var3;
  pointer pTVar4;
  undefined8 uVar5;
  _Base_ptr p_Var6;
  mapped_type_conflict *pmVar7;
  _Rb_tree_node_base *p_Var8;
  const_iterator cVar9;
  uint *puVar10;
  _Rb_tree_node_base *p_Var11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  pointer __x;
  pointer pcVar15;
  mapped_type_conflict index_1;
  mapped_type_conflict index;
  cmGeneratorTarget *dep;
  set<int,_std::less<int>,_std::allocator<int>_> emitted;
  uint local_dc;
  key_type local_d8;
  pointer local_d0;
  cmGraphEdge local_c8;
  cmComputeTargetDepends *local_b0;
  undefined1 local_a8 [4];
  bool local_a4;
  bool local_a3;
  element_type *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  _Rb_tree_node_base *local_90;
  pointer local_78;
  cmGeneratorTarget *local_70;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  __x = (inputEdges->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
        super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.
        super__Vector_impl_data._M_start;
  pcVar15 = (inputEdges->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
            super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_b0 = this;
  local_70 = gt;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (__x != pcVar15) {
    local_78 = pcVar15;
    do {
      if (__x->Strong == true) {
        std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::push_back
                  (&outputEdges->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>,__x);
      }
      else {
        iVar1 = __x->Dest;
        local_d0 = (local_b0->SideEffects).
                   super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pTVar4 = local_d0 + iVar1;
        for (p_Var8 = *(_Base_ptr *)((long)&local_d0[iVar1].CustomCommandSideEffects._M_t + 0x18);
            (_Rb_tree_header *)p_Var8 !=
            (_Rb_tree_header *)((long)&(pTVar4->CustomCommandSideEffects)._M_t + 8U);
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
          local_c8.Dest = p_Var8[1]._M_color;
          local_c8.Strong = (bool)p_Var8[1].field_0x4;
          local_c8.Cross = (bool)p_Var8[1].field_0x5;
          local_c8._6_2_ = *(undefined2 *)&p_Var8[1].field_0x6;
          pmVar7 = std::
                   map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
                   ::operator[](&this->TargetIndex,(key_type *)&local_c8);
          iVar2 = *pmVar7;
          local_d8 = (key_type)CONCAT44(local_d8._4_4_,iVar2);
          if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_004d7355:
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &local_60,(int *)&local_d8);
            local_a3 = __x->Cross;
            local_a0 = (__x->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                       TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
            local_98._M_pi =
                 (__x->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
            if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_98._M_pi)->_M_use_count = (local_98._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_98._M_pi)->_M_use_count = (local_98._M_pi)->_M_use_count + 1;
              }
            }
            local_a8 = (undefined1  [4])(int)local_d8;
            local_a4 = false;
            std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::emplace_back<cmGraphEdge>
                      (&outputEdges->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>,
                       (cmGraphEdge *)local_a8);
            if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98._M_pi);
            }
          }
          else {
            p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var14 = &local_60._M_impl.super__Rb_tree_header._M_header;
            do {
              p_Var13 = p_Var14;
              p_Var12 = p_Var6;
              _Var3 = p_Var12[1]._M_color;
              p_Var14 = p_Var12;
              if ((int)_Var3 < iVar2) {
                p_Var14 = p_Var13;
              }
              p_Var6 = (&p_Var12->_M_left)[(int)_Var3 < iVar2];
            } while ((&p_Var12->_M_left)[(int)_Var3 < iVar2] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var14 == &local_60._M_impl.super__Rb_tree_header)
            goto LAB_004d7355;
            if ((int)_Var3 < iVar2) {
              p_Var12 = p_Var13;
            }
            if (iVar2 < (int)p_Var12[1]._M_color) goto LAB_004d7355;
          }
        }
        cmGeneratorTarget::GetAllConfigCompileLanguages_abi_cxx11_
                  ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_a8,local_70);
        if (local_90 != (_Rb_tree_node_base *)&local_a0) {
          local_68 = &local_d0[iVar1].LanguageSideEffects;
          local_d0 = (pointer)((long)&local_d0[iVar1].LanguageSideEffects._M_t + 8);
          p_Var8 = local_90;
          do {
            cVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
                    ::find(&local_68->_M_t,(key_type *)(p_Var8 + 1));
            if ((pointer)cVar9._M_node != local_d0) {
              for (p_Var11 = cVar9._M_node[2]._M_right;
                  p_Var11 != (_Rb_tree_node_base *)&cVar9._M_node[2]._M_parent;
                  p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
                local_d8 = *(key_type *)(p_Var11 + 1);
                puVar10 = (uint *)std::
                                  map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
                                  ::operator[](&this->TargetIndex,&local_d8);
                local_dc = *puVar10;
                if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_004d74b5:
                  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                  _M_insert_unique<int_const&>
                            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                              *)&local_60,(int *)&local_dc);
                  uVar5 = local_c8._0_8_;
                  local_c8.Cross = __x->Cross;
                  local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (__x->Backtrace).
                            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr;
                  local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi =
                       (__x->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                       TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
                  if (local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                      TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                       .TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (local_c8.Backtrace.
                            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                       .TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (local_c8.Backtrace.
                            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                    }
                  }
                  local_c8.Strong = false;
                  local_c8.Dest = local_dc;
                  local_c8._6_2_ = SUB82(uVar5,6);
                  std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::emplace_back<cmGraphEdge>
                            (&outputEdges->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>,
                             &local_c8);
                  if (local_c8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                      TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_c8.Backtrace.
                               super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
                  }
                }
                else {
                  p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
                  p_Var14 = &local_60._M_impl.super__Rb_tree_header._M_header;
                  do {
                    p_Var13 = p_Var14;
                    p_Var12 = p_Var6;
                    _Var3 = p_Var12[1]._M_color;
                    p_Var14 = p_Var12;
                    if ((int)_Var3 < (int)local_dc) {
                      p_Var14 = p_Var13;
                    }
                    p_Var6 = (&p_Var12->_M_left)[(int)_Var3 < (int)local_dc];
                  } while ((&p_Var12->_M_left)[(int)_Var3 < (int)local_dc] != (_Base_ptr)0x0);
                  if ((_Rb_tree_header *)p_Var14 == &local_60._M_impl.super__Rb_tree_header)
                  goto LAB_004d74b5;
                  if ((int)_Var3 < (int)local_dc) {
                    p_Var12 = p_Var13;
                  }
                  if ((int)local_dc < (int)p_Var12[1]._M_color) goto LAB_004d74b5;
                }
              }
            }
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
          } while (p_Var8 != (_Rb_tree_node_base *)&local_a0);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_a8);
        pcVar15 = local_78;
      }
      __x = __x + 1;
    } while (__x != pcVar15);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return;
}

Assistant:

void cmComputeTargetDepends::OptimizeLinkDependencies(
  cmGeneratorTarget const* gt, cmGraphEdgeList& outputEdges,
  cmGraphEdgeList const& inputEdges)
{
  std::set<int> emitted;
  for (auto const& edge : inputEdges) {
    if (edge.IsStrong()) {
      // Preserve strong edges
      outputEdges.push_back(edge);
    } else {
      auto const& dse = this->SideEffects[edge];

      // Add edges that have custom command side effects
      for (cmGeneratorTarget const* dep : dse.CustomCommandSideEffects) {
        auto index = this->TargetIndex[dep];
        if (!emitted.count(index)) {
          emitted.insert(index);
          outputEdges.push_back(
            cmGraphEdge(index, false, edge.IsCross(), edge.GetBacktrace()));
        }
      }

      // Add edges that have language side effects for languages we
      // care about
      for (auto const& lang : gt->GetAllConfigCompileLanguages()) {
        auto it = dse.LanguageSideEffects.find(lang);
        if (it != dse.LanguageSideEffects.end()) {
          for (cmGeneratorTarget const* dep : it->second) {
            auto index = this->TargetIndex[dep];
            if (!emitted.count(index)) {
              emitted.insert(index);
              outputEdges.push_back(cmGraphEdge(index, false, edge.IsCross(),
                                                edge.GetBacktrace()));
            }
          }
        }
      }
    }
  }
}